

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall
CVmImageWriter::write_entrypt
          (CVmImageWriter *this,uint32_t entry_ofs,size_t method_hdr_size,size_t exc_entry_size,
          size_t line_entry_size,size_t dbg_hdr_size,size_t dbg_lclsym_hdr_size,
          size_t dbg_frame_hdr_size,int dbg_vsn_id)

{
  uint in_ECX;
  uint in_EDX;
  uint in_ESI;
  size_t in_RDI;
  uint in_R8D;
  uint in_R9D;
  uint in_stack_00000008;
  char buf [32];
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  CVmImageWriter *in_stack_ffffffffffffffc0;
  
  ::oswp4(&stack0xffffffffffffffa8,(ulong)in_ESI);
  ::oswp2(&stack0xffffffffffffffac,in_EDX);
  ::oswp2(&stack0xffffffffffffffae,in_ECX);
  ::oswp2(&stack0xffffffffffffffb0,in_R8D);
  ::oswp2(&stack0xffffffffffffffb2,in_R9D);
  ::oswp2(&stack0xffffffffffffffb4,in_stack_00000008);
  ::oswp2(&stack0xffffffffffffffb6,buf._8_4_);
  ::oswp2(&stack0xffffffffffffffb8,buf._0_4_);
  begin_block(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
  CVmFile::write_bytes
            ((CVmFile *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8,in_RDI);
  end_block((CVmImageWriter *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  return;
}

Assistant:

void CVmImageWriter::write_entrypt(uint32_t entry_ofs, size_t method_hdr_size,
                                   size_t exc_entry_size,
                                   size_t line_entry_size,
                                   size_t dbg_hdr_size,
                                   size_t dbg_lclsym_hdr_size,
                                   size_t dbg_frame_hdr_size,
                                   int dbg_vsn_id)
{
    char buf[32];
    
    /* prepare the block's contents */
    oswp4(buf, entry_ofs);
    oswp2(buf+4, method_hdr_size);
    oswp2(buf+6, exc_entry_size);
    oswp2(buf+8, line_entry_size);
    oswp2(buf+10, dbg_hdr_size);
    oswp2(buf+12, dbg_lclsym_hdr_size);
    oswp2(buf+14, dbg_vsn_id);
    oswp2(buf+16, dbg_frame_hdr_size);

    /* open the block, write the data, and close the block */
    begin_block("ENTP", TRUE);
    fp_->write_bytes(buf, 18);
    end_block();
}